

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

RunElement __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::StartGames
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          Games *losers,RunElements *elements,RunElement *sentinel)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  pair<unsigned_int,_unsigned_long> *ppVar6;
  pair<unsigned_int,_unsigned_long> *ppVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  RunElement RVar11;
  uint auStack_218 [2];
  undefined1 auStack_210 [8];
  uint auStack_208 [2];
  unsigned_long local_200 [30];
  uint auStack_110 [2];
  unsigned_long auStack_108 [21];
  uint auStack_60 [2];
  ulong auStack_58 [9];
  
  lVar2 = 8;
  do {
    *(undefined4 *)((long)auStack_208 + lVar2) = 0;
    *(undefined8 *)((long)local_200 + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1f8);
  lVar2 = 0xf8;
  lVar4 = 0;
  ppVar7 = elements->_M_elems;
  do {
    uVar9 = ((pair<unsigned_int,_unsigned_long> *)&ppVar7->first)->first;
    uVar8 = ppVar7[1].first;
    ppVar6 = ppVar7;
    if (uVar9 < uVar8) {
      uVar10 = ppVar7[1].second;
    }
    else if ((uVar8 < uVar9) || (uVar10 = ppVar7[1].second, ppVar7[1].second <= ppVar7->second)) {
      ppVar6 = elements->_M_elems + lVar4 * 2 + 1;
      uVar10 = ppVar7->second;
      uVar8 = uVar9;
    }
    *(uint *)((long)losers->_M_elems + lVar2 + -8) = uVar8;
    *(ulong *)((long)&losers->_M_elems[0].first + lVar2) = uVar10;
    *(uint *)((long)auStack_208 + lVar2) =
         ((pair<unsigned_int,_unsigned_long> *)&ppVar6->first)->first;
    *(unsigned_long *)((long)local_200 + lVar2) = ppVar6->second;
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x10;
    ppVar7 = ppVar7 + 2;
  } while (lVar2 != 0x1f8);
  lVar2 = 0xf4;
  do {
    uVar9 = *(uint *)((long)auStack_218 + lVar2 * 2);
    uVar8 = *(uint *)((long)auStack_208 + lVar2 * 2);
    if (uVar9 < uVar8) {
      uVar5 = *(ulong *)(auStack_210 + lVar2 * 2);
      uVar10 = *(ulong *)((long)local_200 + lVar2 * 2);
      uVar3 = uVar9;
      uVar9 = uVar8;
    }
    else {
      uVar10 = *(ulong *)(auStack_210 + lVar2 * 2);
      uVar1 = *(ulong *)((long)local_200 + lVar2 * 2);
      uVar5 = uVar1;
      uVar3 = uVar8;
      if (uVar9 <= uVar8 && uVar10 < uVar1) {
        uVar5 = uVar10;
        uVar10 = uVar1;
        uVar3 = uVar9;
        uVar9 = uVar8;
      }
    }
    *(uint *)((long)losers->_M_elems + lVar2 + -0x14) = uVar9;
    *(ulong *)((long)losers->_M_elems + lVar2 + -0xc) = uVar10;
    *(uint *)(auStack_210 + lVar2 + -4) = uVar3;
    *(ulong *)(auStack_210 + lVar2 + 4) = uVar5;
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 4);
  RVar11._4_4_ = 0;
  RVar11.first = (uint)local_200[0];
  RVar11.second = local_200[1];
  return RVar11;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}